

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall
NavierStokesBase::create_umac_grown(NavierStokesBase *this,int nGrow,MultiFab *a_divu)

{
  Geometry *geom_;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *__x;
  ostringstream *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  MultiFab *pMVar7;
  MultiFab *pMVar8;
  MultiFab *pMVar9;
  void *pvVar10;
  int iVar11;
  NavierStokesBase *pNVar12;
  NavierStokesBase *pNVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  Geometry *geom__00;
  MultiFab **ppMVar22;
  long lVar23;
  Array<StateDataPhysBCFunct,_3> *physbcf;
  long lVar24;
  _func_int **pp_Var25;
  double dVar26;
  Periodicity PVar27;
  initializer_list<std::array<amrex::MultiFab_*,_3UL>_> __l;
  initializer_list<double> __l_00;
  initializer_list<std::array<amrex::MultiFab_*,_3UL>_> __l_01;
  initializer_list<double> __l_02;
  initializer_list<amrex::MultiFab_*> __l_03;
  initializer_list<double> __l_04;
  NullInterpHook<amrex::FArrayBox> local_62b;
  NullInterpHook<amrex::FArrayBox> local_62a;
  allocator_type local_629;
  Box local_628;
  ulong local_608;
  long local_600;
  long local_5f8;
  long local_5f0;
  long local_5e8;
  long local_5e0;
  long local_5d8;
  MultiFab *local_5d0;
  double *local_5c8;
  int local_5bc;
  Array4<const_double> local_5b8;
  Array<MultiFab_*,_3> u_mac_fine;
  Array4<const_int> local_558;
  Array4<double> local_518;
  Array4<double> local_4d8;
  Box bx2;
  Box bx1;
  IntVect local_458;
  Array4<double> local_448;
  Box bx0;
  Array<int,_3> bf_idx;
  Array<int,_3> bc_idx;
  MFIter mfi;
  Array<Vector<BCRec>,_3> bcrecArr;
  Array<StateDataPhysBCFunct,_3> cbndyFuncArr;
  StateDataPhysBCFunct crse_bndry_func_z;
  StateDataPhysBCFunct crse_bndry_func_y;
  StateDataPhysBCFunct crse_bndry_func_x;
  Array<StateDataPhysBCFunct,_3> fbndyFuncArr;
  iMultiFab mask;
  StateDataPhysBCFunct fine_bndry_func_z;
  StateDataPhysBCFunct fine_bndry_func_y;
  StateDataPhysBCFunct fine_bndry_func_x;
  
  if (0 < nGrow) {
    if (nGrow != 1) {
      mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ =
           amrex::OutStream();
      mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
           *(undefined4 *)(DAT_00816950 + -0x30);
      this_00 = (ostringstream *)
                &mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                 m_bndryReg.m_typ;
      mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase._vptr_FabArrayBase._4_4_ =
           *(undefined4 *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream(this_00);
      *(undefined8 *)
       ((long)&mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op +
       *(long *)(mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_
                + -0x18) + 0xcU) =
           *(undefined8 *)
            (mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ + 8 +
            *(long *)(*(long *)mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.
                               m_bat._0_8_ + -0x18));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,
                 "\n\nWARNING!\n  NSB::create_umac_grown currently only enforces the divergnece constraint on 1 ghost cell, but nGrow > 1\n\n"
                 ,0x76);
      amrex::Print::~Print((Print *)&mask);
    }
    u_mac_fine._M_elems[0] = this->u_mac;
    u_mac_fine._M_elems[1] = u_mac_fine._M_elems[0] + 1;
    u_mac_fine._M_elems[2] = u_mac_fine._M_elems[0] + 2;
    geom_ = &(this->super_AmrLevel).geom;
    amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
              (&fine_bndry_func_x,
               (this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start,0,geom_);
    amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
              (&fine_bndry_func_y,
               (this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start,1,geom_);
    amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
              (&fine_bndry_func_z,
               (this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start,2,geom_);
    fbndyFuncArr._16_8_ = fine_bndry_func_x.geom;
    fbndyFuncArr._0_8_ = fine_bndry_func_x.statedata;
    fbndyFuncArr._8_4_ = fine_bndry_func_x.src_comp;
    fbndyFuncArr._12_4_ = fine_bndry_func_x._12_4_;
    fbndyFuncArr._24_8_ = fine_bndry_func_y.statedata;
    fbndyFuncArr._32_4_ = fine_bndry_func_y.src_comp;
    fbndyFuncArr._36_4_ = fine_bndry_func_y._12_4_;
    fbndyFuncArr._40_8_ = fine_bndry_func_y.geom;
    fbndyFuncArr._64_8_ = fine_bndry_func_z.geom;
    fbndyFuncArr._48_8_ = fine_bndry_func_z.statedata;
    fbndyFuncArr._56_4_ = fine_bndry_func_z.src_comp;
    fbndyFuncArr._60_4_ = fine_bndry_func_z._12_4_;
    iVar18 = (this->super_AmrLevel).level;
    if (iVar18 == 0) {
      ppMVar22 = u_mac_fine._M_elems;
      physbcf = &fbndyFuncArr;
      lVar20 = 0;
      do {
        pMVar7 = this->u_mac;
        bcrecArr._M_elems[0].super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
        super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = nGrow;
        bcrecArr._M_elems[0].super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
        super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = nGrow;
        bcrecArr._M_elems[0].super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
        super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = nGrow;
        cbndyFuncArr._0_8_ = *ppMVar22;
        __l_03._M_len = 1;
        __l_03._M_array = (iterator)&cbndyFuncArr;
        std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                  ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mask,__l_03,
                   (allocator_type *)&local_5b8);
        local_558.p = (int *)0x0;
        __l_04._M_len = 1;
        __l_04._M_array = (iterator)&local_558;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&mfi,__l_04,
                   (allocator_type *)&local_448);
        amrex::FillPatchSingleLevel<amrex::MultiFab,amrex::StateDataPhysBCFunct>
                  ((MultiFab *)
                   ((long)&(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                           _vptr_FabArrayBase + lVar20),(IntVect *)&bcrecArr,0.0,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mask,
                   (Vector<double,_std::allocator<double>_> *)&mfi,0,0,1,geom_,
                   (StateDataPhysBCFunct *)physbcf,0);
        pvVar10 = (void *)CONCAT71(mfi.m_fa._M_t.
                                   super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                   .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                                   ._1_7_,mfi.m_fa._M_t.
                                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                          _M_head_impl._0_1_);
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10,mfi.tile_size.vect._0_8_ - (long)pvVar10);
        }
        pvVar10 = (void *)CONCAT44(mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.
                                   _vptr_FabArrayBase._4_4_,
                                   mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.
                                   _vptr_FabArrayBase._0_4_);
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10,mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.
                                  m_bat.m_op._4_8_ - (long)pvVar10);
        }
        lVar20 = lVar20 + 0x180;
        ppMVar22 = ppMVar22 + 1;
        physbcf = (Array<StateDataPhysBCFunct,_3> *)&physbcf->field_0x18;
      } while (lVar20 != 0x480);
    }
    else {
      pNVar12 = getLevel(this,iVar18 + -1);
      pMVar7 = pNVar12->u_mac;
      pNVar12 = getLevel(this,(this->super_AmrLevel).level + -1);
      pMVar8 = pNVar12->u_mac;
      pNVar12 = getLevel(this,(this->super_AmrLevel).level + -1);
      pMVar9 = pNVar12->u_mac;
      pNVar12 = getLevel(this,(this->super_AmrLevel).level + -1);
      __x = &this->m_bcrec_velocity;
      std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&bcrecArr,
                 &__x->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
      std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                (&bcrecArr._M_elems[1].super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
                 &__x->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
      std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                (&bcrecArr._M_elems[2].super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
                 &__x->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
      bc_idx._M_elems[0] = 0;
      bc_idx._M_elems[1] = 1;
      bc_idx._M_elems[2] = 2;
      pNVar13 = getLevel(this,(this->super_AmrLevel).level + -1);
      geom__00 = &(pNVar12->super_AmrLevel).geom;
      amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
                (&crse_bndry_func_x,
                 (pNVar13->super_AmrLevel).state.
                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start,0,geom__00);
      pNVar12 = getLevel(this,(this->super_AmrLevel).level + -1);
      amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
                (&crse_bndry_func_y,
                 (pNVar12->super_AmrLevel).state.
                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start,1,geom__00);
      pNVar12 = getLevel(this,(this->super_AmrLevel).level + -1);
      amrex::StateDataPhysBCFunct::StateDataPhysBCFunct
                (&crse_bndry_func_z,
                 (pNVar12->super_AmrLevel).state.
                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start,2,geom__00);
      bf_idx._M_elems[2] = 0;
      bf_idx._M_elems[0] = 0;
      bf_idx._M_elems[1] = 0;
      cbndyFuncArr._16_8_ = crse_bndry_func_x.geom;
      cbndyFuncArr._0_8_ = crse_bndry_func_x.statedata;
      cbndyFuncArr._8_4_ = crse_bndry_func_x.src_comp;
      cbndyFuncArr._12_4_ = crse_bndry_func_x._12_4_;
      cbndyFuncArr._24_8_ = crse_bndry_func_y.statedata;
      cbndyFuncArr._32_4_ = crse_bndry_func_y.src_comp;
      cbndyFuncArr._36_4_ = crse_bndry_func_y._12_4_;
      cbndyFuncArr._40_8_ = crse_bndry_func_y.geom;
      cbndyFuncArr._48_8_ = crse_bndry_func_z.statedata;
      cbndyFuncArr._56_4_ = crse_bndry_func_z.src_comp;
      cbndyFuncArr._60_4_ = crse_bndry_func_z._12_4_;
      cbndyFuncArr._64_8_ = crse_bndry_func_z.geom;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = SUB81(pMVar7,0);
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ =
           (undefined7)((ulong)pMVar7 >> 8);
      __l._M_len = 1;
      __l._M_array = (iterator)&mfi;
      local_4d8.p._0_4_ = nGrow;
      local_4d8.p._4_4_ = nGrow;
      local_4d8.jstride._0_4_ = nGrow;
      mfi.tile_size.vect._0_8_ = pMVar9 + 2;
      mfi.fabArray = (FabArrayBase *)(pMVar8 + 1);
      std::
      vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
      ::vector((vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                *)&mask,__l,(allocator_type *)&bx1);
      local_628.smallend.vect[0] = 0;
      local_628.smallend.vect[1] = 0;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_628;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_558,__l_00,(allocator_type *)&bx2
                );
      local_448.kstride = (Long)u_mac_fine._M_elems[2];
      local_448.p = (double *)u_mac_fine._M_elems[0];
      local_448.jstride = (Long)u_mac_fine._M_elems[1];
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&local_448;
      std::
      vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
      ::vector((vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                *)&local_5b8,__l_01,(allocator_type *)&local_458);
      bx0.smallend.vect[0] = 0;
      bx0.smallend.vect[1] = 0;
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&bx0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_518,__l_02,&local_629);
      amrex::
      FillPatchTwoLevels<amrex::MultiFab,amrex::StateDataPhysBCFunct,amrex::Interpolater,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
                (&u_mac_fine,(IntVect *)&local_4d8,0.0,
                 (Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                  *)&mask,(Vector<double,_std::allocator<double>_> *)&local_558,
                 (Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                  *)&local_5b8,(Vector<double,_std::allocator<double>_> *)&local_518,0,0,1,geom__00,
                 geom_,&cbndyFuncArr,&bf_idx,&fbndyFuncArr,&bf_idx,
                 &(this->super_AmrLevel).crse_ratio,(Interpolater *)&amrex::face_linear_interp,
                 &bcrecArr,&bc_idx,&local_62a,&local_62b);
      if (local_518.p != (double *)0x0) {
        operator_delete(local_518.p,local_518.kstride - (long)local_518.p);
      }
      if (local_5b8.p != (double *)0x0) {
        operator_delete(local_5b8.p,local_5b8.kstride - (long)local_5b8.p);
      }
      if (local_558.p != (int *)0x0) {
        operator_delete(local_558.p,local_558.kstride - (long)local_558.p);
      }
      pvVar10 = (void *)CONCAT44(mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.
                                 _vptr_FabArrayBase._4_4_,
                                 mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.
                                 _vptr_FabArrayBase._0_4_);
      if (pvVar10 != (void *)0x0) {
        operator_delete(pvVar10,mask.super_FabArray<amrex::IArrayBox>.super_FabArrayBase.boxarray.
                                m_bat.m_op._4_8_ - (long)pvVar10);
      }
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
      mfi.fabArray._0_4_ = 0;
      mfi.fabArray._4_4_ = 0;
      mfi.tile_size.vect[0] = 0;
      mfi.tile_size.vect[1] = 0;
      mfi.tile_size.vect[2] = 0;
      mfi.flags = '\0';
      mfi._29_3_ = 0;
      mfi.currentIndex = 0;
      mfi.beginIndex = 0;
      local_558.p = (int *)&PTR__FabFactory_0080c508;
      amrex::iMultiFab::iMultiFab
                (&mask,&(this->super_AmrLevel).grids,
                 &(u_mac_fine._M_elems[0]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                  distributionMap,1,1,(MFInfo *)&mfi,(FabFactory<amrex::IArrayBox> *)&local_558);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mfi.tile_size);
      PVar27 = amrex::Geometry::periodicity(geom_);
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
           (undefined1)PVar27.period.vect[0];
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ =
           PVar27.period.vect._1_7_;
      mfi.fabArray._0_4_ = PVar27.period.vect[2];
      amrex::FabArray<amrex::IArrayBox>::BuildMask<amrex::IArrayBox,_0>
                (&mask.super_FabArray<amrex::IArrayBox>,&(this->super_AmrLevel).geom.domain,
                 (Periodicity *)&mfi,0,1,0,0);
      dVar1 = (this->super_AmrLevel).geom.super_CoordSys.dx[0];
      dVar2 = (this->super_AmrLevel).geom.super_CoordSys.dx[1];
      dVar3 = (this->super_AmrLevel).geom.super_CoordSys.dx[2];
      dVar4 = (this->super_AmrLevel).geom.super_CoordSys.inv_dx[0];
      dVar5 = (this->super_AmrLevel).geom.super_CoordSys.inv_dx[1];
      dVar6 = (this->super_AmrLevel).geom.super_CoordSys.inv_dx[2];
      amrex::MFIter::MFIter(&mfi,(FabArrayBase *)&mask,true);
      if (mfi.currentIndex < mfi.endIndex) {
        do {
          amrex::MFIter::tilebox(&local_628,&mfi);
          amrex::FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    (&local_558,&mask.super_FabArray<amrex::IArrayBox>,&mfi);
          if (a_divu == (MultiFab *)0x0) {
            local_5b8.kstride = 0;
            local_5b8.nstride = 0;
            local_5b8.p = (double *)0x0;
            local_5b8.jstride = 0;
            local_5b8.begin.x = 1;
            local_5b8.begin.y = 1;
            local_5b8.begin.z = 1;
            local_5b8.end.x = 0;
            local_5b8.end.y = 0;
            local_5b8.end.z = 0;
            local_5b8.ncomp = 0;
          }
          else {
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_5b8,&a_divu->super_FabArray<amrex::FArrayBox>,&mfi);
          }
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_448,&u_mac_fine._M_elems[0]->super_FabArray<amrex::FArrayBox>,&mfi);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_518,&u_mac_fine._M_elems[1]->super_FabArray<amrex::FArrayBox>,&mfi);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_4d8,&u_mac_fine._M_elems[2]->super_FabArray<amrex::FArrayBox>,&mfi);
          bx1.smallend.vect[0] = 1;
          bx1.smallend.vect[1] = 0;
          bx1.smallend.vect[2] = 0;
          amrex::MFIter::growntilebox(&bx0,&mfi,&bx1.smallend);
          bx2.smallend.vect[0] = 0;
          bx2.smallend.vect[1] = 1;
          bx2.smallend.vect[2] = 0;
          amrex::MFIter::growntilebox(&bx1,&mfi,&bx2.smallend);
          local_458.vect[0] = 0;
          local_458.vect[1] = 0;
          local_458.vect[2] = 1;
          amrex::MFIter::growntilebox(&bx2,&mfi,&local_458);
          if (bx0.smallend.vect[2] <= bx0.bigend.vect[2]) {
            local_608 = (ulong)(uint)bx0.bigend.vect[1];
            lVar20 = (long)bx0.smallend.vect[0];
            local_5e8 = lVar20 * 4;
            local_5f0 = lVar20 * 8;
            local_5f8 = CONCAT44(local_5f8._4_4_,bx0.smallend.vect[0] + 1);
            local_600 = CONCAT44(local_600._4_4_,bx0.bigend.vect[2] + 1);
            iVar18 = bx0.smallend.vect[2];
            do {
              if (bx0.smallend.vect[1] <= bx0.bigend.vect[1]) {
                local_5e0 = CONCAT44(local_5e0._4_4_,iVar18 + 1);
                iVar11 = bx0.smallend.vect[1];
                do {
                  if (bx0.smallend.vect[0] <= bx0.bigend.vect[0]) {
                    lVar14 = (iVar11 - local_448.begin.y) * local_448.jstride;
                    lVar16 = (iVar18 - local_448.begin.z) * local_448.kstride;
                    local_5d0 = (MultiFab *)(long)((iVar11 + 1) - local_518.begin.y);
                    local_5d8 = (long)((iVar18 + 1) - local_4d8.begin.z);
                    iVar19 = (bx0.smallend.vect[0] + 1) - local_448.begin.x;
                    local_5c8 = (double *)
                                ((long)local_448.p +
                                lVar16 * 8 + lVar14 * 8 + (long)local_448.begin.x * -8 + local_5f0);
                    lVar17 = (long)(iVar11 - local_4d8.begin.y) *
                             CONCAT44(local_4d8.jstride._4_4_,(int)local_4d8.jstride);
                    lVar15 = CONCAT44(local_4d8.p._4_4_,(int)local_4d8.p) + local_5f0;
                    lVar21 = (iVar18 - local_518.begin.z) * local_518.kstride;
                    lVar24 = 0;
                    do {
                      lVar23 = lVar20 + lVar24;
                      if ((((((lVar23 < local_628.smallend.vect[0]) ||
                             (local_628.bigend.vect[0] < lVar23)) ||
                            (iVar11 < local_628.smallend.vect[1])) ||
                           ((local_628.bigend.vect[1] < iVar11 ||
                            (iVar18 < local_628.smallend.vect[2])))) ||
                          (local_628.bigend.vect[2] < iVar18)) &&
                         (*(int *)((long)local_558.p +
                                  lVar24 * 4 +
                                  (iVar18 - local_558.begin.z) * local_558.kstride * 4 +
                                  (iVar11 - local_558.begin.y) * local_558.jstride * 4 +
                                  (long)local_558.begin.x * -4 + local_5e8) == 1)) {
                        if (local_5b8.p == (double *)0x0) {
                          dVar26 = 0.0;
                        }
                        else {
                          dVar26 = local_5b8.p
                                   [lVar20 + (((iVar18 - local_5b8.begin.z) * local_5b8.kstride +
                                              (iVar11 - local_5b8.begin.y) * local_5b8.jstride +
                                              lVar24) - (long)local_5b8.begin.x)];
                        }
                        dVar26 = (((*(double *)
                                     ((long)local_518.p +
                                     lVar24 * 8 +
                                     (long)local_5d0 * local_518.jstride * 8 + lVar21 * 8 +
                                     (long)local_518.begin.x * -8 + local_5f0) -
                                   *(double *)
                                    ((long)local_518.p +
                                    lVar24 * 8 +
                                    local_518.jstride * 8 * (long)(iVar11 - local_518.begin.y) +
                                    lVar21 * 8 + (long)local_518.begin.x * -8 + local_5f0)) * dVar5
                                  + (*(double *)
                                      (local_4d8.kstride * 8 * local_5d8 + lVar17 * 8 +
                                       (long)local_4d8.begin.x * -8 + lVar15 + lVar24 * 8) -
                                    *(double *)
                                     ((long)(iVar18 - local_4d8.begin.z) * local_4d8.kstride * 8 +
                                      lVar17 * 8 + (long)local_4d8.begin.x * -8 + lVar15 +
                                     lVar24 * 8)) * dVar6) - dVar26) * dVar1;
                        if (lVar23 < local_628.smallend.vect[0]) {
                          pp_Var25 = (_func_int **)
                                     (dVar26 + (double)(&(((FabArray<amrex::FArrayBox> *)local_448.p
                                                          )->super_FabArrayBase)._vptr_FabArrayBase)
                                                       [lVar14 + lVar16 + (iVar19 + (int)lVar24)]);
                          lVar23 = (lVar20 - local_448.begin.x) + lVar24;
                        }
                        else {
                          if (lVar23 <= local_628.bigend.vect[0]) goto LAB_00342053;
                          pp_Var25 = (_func_int **)(local_5c8[lVar24] - dVar26);
                          lVar23 = (long)(iVar19 + (int)lVar24);
                        }
                        (&(((FabArray<amrex::FArrayBox> *)local_448.p)->super_FabArrayBase).
                          _vptr_FabArrayBase)[lVar14 + lVar16 + lVar23] = pp_Var25;
                      }
LAB_00342053:
                      lVar24 = lVar24 + 1;
                    } while ((bx0.bigend.vect[0] - bx0.smallend.vect[0]) + 1 != (int)lVar24);
                  }
                  iVar11 = iVar11 + 1;
                } while (iVar11 != bx0.bigend.vect[1] + 1);
              }
              iVar18 = iVar18 + 1;
            } while (iVar18 != bx0.bigend.vect[2] + 1);
          }
          if (bx1.smallend.vect[2] <= bx1.bigend.vect[2]) {
            lVar20 = (long)bx1.smallend.vect[0];
            local_5f8 = lVar20 * 4;
            local_600 = lVar20 * 8;
            local_608 = CONCAT44(local_608._4_4_,bx1.bigend.vect[2] + 1);
            local_5bc = bx1.smallend.vect[1];
            local_5e8 = CONCAT44(local_5e8._4_4_,bx1.bigend.vect[0]);
            local_5f0 = CONCAT44(local_5f0._4_4_,bx1.bigend.vect[1] + 1);
            iVar18 = bx1.smallend.vect[2];
            do {
              if (bx1.smallend.vect[1] <= bx1.bigend.vect[1]) {
                iVar11 = bx1.smallend.vect[1];
                do {
                  if (bx1.smallend.vect[0] <= bx1.bigend.vect[0]) {
                    lVar16 = (iVar11 - local_448.begin.y) * local_448.jstride;
                    lVar21 = (iVar18 - local_448.begin.z) * local_448.kstride;
                    local_5d8 = lVar21 * 8 + lVar16 * 8;
                    local_5e0 = CONCAT44(local_5e0._4_4_,iVar18 - local_4d8.begin.z);
                    local_5d0 = (MultiFab *)local_448.p;
                    local_5c8 = local_5b8.p +
                                lVar20 + (((iVar11 - local_5b8.begin.y) * local_5b8.jstride +
                                          (iVar18 - local_5b8.begin.z) * local_5b8.kstride) -
                                         (long)local_5b8.begin.x);
                    lVar15 = (iVar18 - local_518.begin.z) * local_518.kstride;
                    lVar14 = (long)(iVar11 - local_518.begin.y) * local_518.jstride * 8 + lVar15 * 8
                             + (long)local_518.begin.x * -8 + local_600;
                    lVar15 = local_518.jstride * 8 * (long)((iVar11 + 1) - local_518.begin.y) +
                             lVar15 * 8 + (long)local_518.begin.x * -8 + local_600;
                    lVar24 = (long)(iVar11 - local_4d8.begin.y) *
                             CONCAT44(local_4d8.jstride._4_4_,(int)local_4d8.jstride);
                    lVar17 = CONCAT44(local_4d8.p._4_4_,(int)local_4d8.p) + local_600;
                    lVar23 = 0;
                    do {
                      if ((((lVar20 + lVar23 < (long)local_628.smallend.vect[0]) ||
                           ((long)local_628.bigend.vect[0] < lVar20 + lVar23)) ||
                          ((iVar11 < local_628.smallend.vect[1] ||
                           (((local_628.bigend.vect[1] < iVar11 ||
                             (iVar18 < local_628.smallend.vect[2])) ||
                            (local_628.bigend.vect[2] < iVar18)))))) &&
                         (*(int *)((long)local_558.p +
                                  lVar23 * 4 +
                                  (iVar11 - local_558.begin.y) * local_558.jstride * 4 +
                                  (iVar18 - local_558.begin.z) * local_558.kstride * 4 +
                                  (long)local_558.begin.x * -4 + local_5f8) == 1)) {
                        if (local_5b8.p == (double *)0x0) {
                          dVar26 = 0.0;
                        }
                        else {
                          dVar26 = local_5c8[lVar23];
                        }
                        dVar26 = ((((double)(&(((FabArray<amrex::FArrayBox> *)local_448.p)->
                                              super_FabArrayBase)._vptr_FabArrayBase)
                                            [lVar16 + lVar21 + (((bx1.smallend.vect[0] + 1) -
                                                                local_448.begin.x) + (int)lVar23)] -
                                   *(double *)
                                    ((long)local_448.p +
                                    lVar23 * 8 +
                                    local_5d8 + (long)local_448.begin.x * -8 + local_600)) * dVar4 +
                                  (*(double *)
                                    (local_4d8.kstride * 8 *
                                     (long)((iVar18 + 1) - local_4d8.begin.z) + lVar24 * 8 +
                                     (long)local_4d8.begin.x * -8 + lVar17 + lVar23 * 8) -
                                  *(double *)
                                   ((long)(iVar18 - local_4d8.begin.z) * local_4d8.kstride * 8 +
                                    lVar24 * 8 + (long)local_4d8.begin.x * -8 + lVar17 + lVar23 * 8)
                                  ) * dVar6) - dVar26) * dVar2;
                        if (iVar11 < local_628.smallend.vect[1]) {
                          *(double *)((long)local_518.p + lVar23 * 8 + lVar14) =
                               dVar26 + *(double *)((long)local_518.p + lVar23 * 8 + lVar15);
                        }
                        else if (local_628.bigend.vect[1] < iVar11) {
                          *(double *)((long)local_518.p + lVar23 * 8 + lVar15) =
                               *(double *)((long)local_518.p + lVar23 * 8 + lVar14) - dVar26;
                        }
                      }
                      lVar23 = lVar23 + 1;
                    } while ((bx1.bigend.vect[0] - bx1.smallend.vect[0]) + 1 != (int)lVar23);
                  }
                  iVar11 = iVar11 + 1;
                } while (iVar11 != bx1.bigend.vect[1] + 1);
              }
              iVar18 = iVar18 + 1;
            } while (iVar18 != bx1.bigend.vect[2] + 1);
          }
          if (bx2.smallend.vect[2] <= bx2.bigend.vect[2]) {
            local_608 = (ulong)(uint)bx2.bigend.vect[1];
            lVar20 = (long)bx2.smallend.vect[0];
            local_5e8 = lVar20 * 4;
            local_5f0 = lVar20 * 8;
            local_5f8 = CONCAT44(local_5f8._4_4_,bx2.smallend.vect[0] + 1);
            local_600 = CONCAT44(local_600._4_4_,bx2.bigend.vect[2] + 1);
            iVar18 = bx2.smallend.vect[2];
            do {
              if (bx2.smallend.vect[1] <= bx2.bigend.vect[1]) {
                iVar11 = bx2.smallend.vect[1];
                do {
                  if (bx2.smallend.vect[0] <= bx2.bigend.vect[0]) {
                    local_5d0 = (MultiFab *)CONCAT44(local_5d0._4_4_,iVar11 + 1);
                    lVar16 = (iVar11 - local_448.begin.y) * local_448.jstride;
                    lVar14 = (iVar18 - local_448.begin.z) * local_448.kstride;
                    local_5d8 = (long)local_518.begin.x;
                    local_5e0 = (long)((iVar11 + 1) - local_518.begin.y);
                    local_5c8 = local_5b8.p +
                                lVar20 + (((iVar11 - local_5b8.begin.y) * local_5b8.jstride +
                                          (iVar18 - local_5b8.begin.z) * local_5b8.kstride) -
                                         (long)local_5b8.begin.x);
                    lVar21 = (long)(iVar11 - local_4d8.begin.y) *
                             CONCAT44(local_4d8.jstride._4_4_,(int)local_4d8.jstride);
                    lVar15 = CONCAT44(local_4d8.p._4_4_,(int)local_4d8.p) + local_5f0;
                    lVar17 = (long)((iVar18 + 1) - local_4d8.begin.z) * local_4d8.kstride * 8 +
                             lVar21 * 8 + (long)local_4d8.begin.x * -8 + lVar15;
                    lVar15 = local_4d8.kstride * 8 * (long)(iVar18 - local_4d8.begin.z) + lVar21 * 8
                             + (long)local_4d8.begin.x * -8 + lVar15;
                    lVar24 = (iVar18 - local_518.begin.z) * local_518.kstride;
                    lVar21 = 0;
                    do {
                      if (((((lVar20 + lVar21 < (long)local_628.smallend.vect[0]) ||
                            ((long)local_628.bigend.vect[0] < lVar20 + lVar21)) ||
                           ((iVar11 < local_628.smallend.vect[1] ||
                            ((local_628.bigend.vect[1] < iVar11 ||
                             (iVar18 < local_628.smallend.vect[2])))))) ||
                          (local_628.bigend.vect[2] < iVar18)) &&
                         (*(int *)((long)local_558.p +
                                  lVar21 * 4 +
                                  (iVar18 - local_558.begin.z) * local_558.kstride * 4 +
                                  (iVar11 - local_558.begin.y) * local_558.jstride * 4 +
                                  (long)local_558.begin.x * -4 + local_5e8) == 1)) {
                        if (local_5b8.p == (double *)0x0) {
                          dVar26 = 0.0;
                        }
                        else {
                          dVar26 = local_5c8[lVar21];
                        }
                        dVar26 = (((*(double *)
                                     ((long)local_518.p +
                                     lVar21 * 8 +
                                     local_5e0 * local_518.jstride * 8 + lVar24 * 8 + local_5d8 * -8
                                     + local_5f0) -
                                   *(double *)
                                    ((long)local_518.p +
                                    lVar21 * 8 +
                                    local_518.jstride * 8 * (long)(iVar11 - local_518.begin.y) +
                                    lVar24 * 8 + local_5d8 * -8 + local_5f0)) * dVar5 +
                                  ((double)(&(((FabArray<amrex::FArrayBox> *)local_448.p)->
                                             super_FabArrayBase)._vptr_FabArrayBase)
                                           [lVar16 + lVar14 + (((bx2.smallend.vect[0] + 1) -
                                                               local_448.begin.x) + (int)lVar21)] -
                                  *(double *)
                                   ((long)local_448.p +
                                   lVar21 * 8 +
                                   lVar14 * 8 + lVar16 * 8 + (long)local_448.begin.x * -8 +
                                   local_5f0)) * dVar4) - dVar26) * dVar3;
                        if (iVar18 < local_628.smallend.vect[2]) {
                          *(double *)(lVar15 + lVar21 * 8) =
                               dVar26 + *(double *)(lVar17 + lVar21 * 8);
                        }
                        else if (local_628.bigend.vect[2] < iVar18) {
                          *(double *)(lVar17 + lVar21 * 8) =
                               *(double *)(lVar15 + lVar21 * 8) - dVar26;
                        }
                      }
                      lVar21 = lVar21 + 1;
                    } while ((bx2.bigend.vect[0] - bx2.smallend.vect[0]) + 1 != (int)lVar21);
                  }
                  iVar11 = iVar11 + 1;
                } while (iVar11 != bx2.bigend.vect[1] + 1);
              }
              iVar18 = iVar18 + 1;
            } while (iVar18 != bx2.bigend.vect[2] + 1);
          }
          amrex::MFIter::operator++(&mfi);
        } while (mfi.currentIndex < mfi.endIndex);
      }
      amrex::MFIter::~MFIter(&mfi);
      amrex::iMultiFab::~iMultiFab(&mask);
      lVar20 = 0x48;
      do {
        pvVar10 = *(void **)((long)(&mfi.tile_size + 4) + lVar20 + 8);
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10,*(long *)((long)(&mfi.tile_size + 6) + lVar20) - (long)pvVar10);
        }
        lVar20 = lVar20 + -0x18;
      } while (lVar20 != 0);
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::create_umac_grown (int nGrow,
                                     const MultiFab* a_divu)
{
    if ( nGrow <= 0 ) { return; }
    if ( nGrow > 1 )  { Print()<<"\n\nWARNING!\n  NSB::create_umac_grown currently only enforces the divergnece constraint on 1 ghost cell, but nGrow > 1\n\n"; }


    Array<MultiFab*, AMREX_SPACEDIM> u_mac_fine;
    AMREX_D_TERM(u_mac_fine[0] = &u_mac[0];,
                 u_mac_fine[1] = &u_mac[1];,
                 u_mac_fine[2] = &u_mac[2];);

    Geometry *fine_geom = &geom;

    //Grab the velocity phys bc fill function from the StateData StateDescriptor
    AMREX_D_TERM(StateDataPhysBCFunct fine_bndry_func_x(get_state_data(State_Type),0,geom);,
                 StateDataPhysBCFunct fine_bndry_func_y(get_state_data(State_Type),1,geom);,
                 StateDataPhysBCFunct fine_bndry_func_z(get_state_data(State_Type),2,geom););

    Array<StateDataPhysBCFunct,AMREX_SPACEDIM> fbndyFuncArr = {AMREX_D_DECL(fine_bndry_func_x,
									    fine_bndry_func_y,
									    fine_bndry_func_z)};


    if ( level == 0 )
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            //
            // BDS needs physical BCs filled.
            // Godunov needs periodic ghosts filled (and handles physical BCs internally).
            //
            Real fake_time = 0.;
            amrex::FillPatchSingleLevel(u_mac[idim], IntVect(nGrow), fake_time,
                                        {u_mac_fine[idim]}, {fake_time},
                                        0, 0, 1, geom,
                                        fbndyFuncArr[idim], 0);
        }
    }
    else // level > 0
    {
        Array<MultiFab*, AMREX_SPACEDIM> u_mac_crse;
        AMREX_D_TERM(u_mac_crse[0] = &getLevel(level-1).u_mac[0];,
                     u_mac_crse[1] = &getLevel(level-1).u_mac[1];,
                     u_mac_crse[2] = &getLevel(level-1).u_mac[2];);

        Geometry *crse_geom = &getLevel(level-1).geom;

        //
        // First interpolate, ignoring divergence constraint. Then correct
        // the 1-cell wide halo of ghosts cells we need to enforce the
        // constraint.
        //

        // Divergence preserving interp -- This is for case of MAC solve on
        // composite grid; doesn't make sense to use it here.
        //Interpolater* mapper = &face_divfree_interp;
        // Use linear interpolation, which matches up with old create umac grown
        Interpolater* mapper = &face_linear_interp;

        // This never actually gets used because the FaceLinear Interpolator doesn't use it.
        // Inside FillPatchTwoLevels, it's only use is that it's passed to the interpolator.
        // Fill it with the correct thing anyway.
        Array<Vector<BCRec>,AMREX_SPACEDIM> bcrecArr = {AMREX_D_DECL(m_bcrec_velocity,
                                                                     m_bcrec_velocity,
                                                                     m_bcrec_velocity)};
        Array<int, AMREX_SPACEDIM> bc_idx = {AMREX_D_DECL(0,1,2)};

        // Grab the velocity phys bc fill function from the StateData StateDescriptor
        // This will use the BCRec for velocity stored in the StateDescriptor
        AMREX_D_TERM(
            StateDataPhysBCFunct crse_bndry_func_x(getLevel(level-1).get_state_data(State_Type),0,*crse_geom);,
            StateDataPhysBCFunct crse_bndry_func_y(getLevel(level-1).get_state_data(State_Type),1,*crse_geom);,
            StateDataPhysBCFunct crse_bndry_func_z(getLevel(level-1).get_state_data(State_Type),2,*crse_geom););
        Array<int, AMREX_SPACEDIM> bf_idx = {AMREX_D_DECL(0,0,0)};

        Array<StateDataPhysBCFunct,AMREX_SPACEDIM> cbndyFuncArr = {AMREX_D_DECL(crse_bndry_func_x,
										crse_bndry_func_y,
										crse_bndry_func_z)};

        // Use piecewise constant interpolation in time, so create ficticious variable for time
        Real fake_time = 0.;

        FillPatchTwoLevels(u_mac_fine, IntVect(nGrow), fake_time,
                           {u_mac_crse}, {fake_time},
                           {u_mac_fine}, {fake_time},
                           0, 0, 1,
                           *crse_geom, *fine_geom,
                           cbndyFuncArr, bf_idx, fbndyFuncArr, bf_idx,
                           crse_ratio, mapper, bcrecArr, bc_idx);

        //
        // Correct u_mac to enforce the divergence constraint in the ghost cells.
        // Do this by adjusting only the outer face (wrt the valid region) of the ghost
        // cell, i.e. for the hi-x face, adjust umac_x(i+1).
        // NOTE that this does not fill edges or corners.
        //

        // Build mask to find the ghost cells we need to correct.
        // covered   : ghost cells covered by valid cells of this FabArray
        //             (including periodically shifted valid cells)
        // notcovered: ghost cells not covered by valid cells
        //             (including ghost cells outside periodic boundaries)
        // physbnd   : boundary cells outside the domain (excluding periodic boundaries)
        // interior  : interior cells (i.e., valid cells)
        int covered   = 0;
        int uncovered = 1;
        int physbnd   = 0;
        int interior  = 0;
        iMultiFab mask(grids, u_mac_fine[0]->DistributionMap(), 1, 1, MFInfo(),
                       DefaultFabFactory<IArrayBox>());
        mask.BuildMask(fine_geom->Domain(), fine_geom->periodicity(),
                       covered, uncovered, physbnd, interior);

        const GpuArray<Real,AMREX_SPACEDIM> dx = fine_geom->CellSizeArray();
        const GpuArray<Real,AMREX_SPACEDIM> dxinv = fine_geom->InvCellSizeArray();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mask,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            auto const& maskarr = mask.const_array(mfi);
            Array4<const Real> foo;
            auto const& divu = (a_divu) ? a_divu->const_array(mfi) : foo;
            AMREX_D_TERM(auto const& umac = u_mac_fine[0]->array(mfi);,
                         auto const& vmac = u_mac_fine[1]->array(mfi);,
                         auto const& wmac = u_mac_fine[2]->array(mfi));

            // Fuse the launches, 1 for each dimension, into a single launch.
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM_FLAG(RunOn::Gpu,
                mfi.growntilebox(IntVect::TheDimensionVector(0)), bx0,
                {
                    AMREX_LOOP_3D(bx0, i, j, k,
                    {
                        if ( !bx.contains(i,j,k) && (maskarr(i,j,k) == uncovered) )
                        {
                            Real tmp = (divu) ? divu(i,j,k) : 0.0;

                            tmp =  dx[0] * (   dxinv[1]*(vmac(i,j+1,k) - vmac(i,j,k))
#if (AMREX_SPACEDIM == 3)
                                             + dxinv[2]*(wmac(i,j,k+1) - wmac(i,j,k))
#endif
                                             - tmp );

                            if ( i < bx.smallEnd(0) )
                            {
                                umac(i,j,k) = umac(i+1,j,k) + tmp;
                            }
                            else if ( i > bx.bigEnd(0) )
                            {
                                umac(i+1,j,k) = umac(i,j,k) - tmp;
                            }
                        }
                    });
                },
                mfi.growntilebox(IntVect::TheDimensionVector(1)), bx1,
                {
                    AMREX_LOOP_3D(bx1, i, j, k,
                    {
                        if ( !bx.contains(i,j,k) && (maskarr(i,j,k) == uncovered) )
                        {
                            Real tmp = (divu) ? divu(i,j,k) : 0.0;

                            tmp =  dx[1] * (   dxinv[0]*(umac(i+1,j,k) - umac(i,j,k))
#if (AMREX_SPACEDIM == 3)
                                             + dxinv[2]*(wmac(i,j,k+1) - wmac(i,j,k))
#endif
                                             - tmp );

                            if ( j < bx.smallEnd(1) )
                            {
                                vmac(i,j,k) = vmac(i,j+1,k) + tmp;
                            }
                            else if ( j > bx.bigEnd(1) )
                            {
                                vmac(i,j+1,k) = vmac(i,j,k) - tmp;
                            }
                        }
                    });
                },
                mfi.growntilebox(IntVect::TheDimensionVector(2)), bx2,
                {
                    AMREX_LOOP_3D(bx2, i, j, k,
                    {
                        if ( !bx.contains(i,j,k) && (maskarr(i,j,k) == uncovered) )
                        {
                            Real tmp = (divu) ? divu(i,j,k) : 0.0;

                            tmp =  dx[2] * (   dxinv[1]*(vmac(i,j+1,k) - vmac(i,j,k))
                                             + dxinv[0]*(umac(i+1,j,k) - umac(i,j,k))
                                             - tmp );

                            if ( k < bx.smallEnd(2) )
                            {
                                wmac(i,j,k) = wmac(i,j,k+1) + tmp;
                            }
                            else if ( k > bx.bigEnd(2) )
                            {
                                wmac(i,j,k+1) = wmac(i,j,k) - tmp;
                            }
                        }
                    });
                });
        }
    }
}